

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

int __thiscall
glcts::TextureCubeMapArraySamplingTest::vertexArrayObjectDefinition::init
          (vertexArrayObjectDefinition *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  GLenum GVar2;
  int iVar3;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  ulong uVar5;
  uint *in_RCX;
  long in_RDX;
  attributeDefinition *paVar6;
  bufferCollection *in_R8;
  GLuint in_R9D;
  attributeDefinition *attribute;
  long lVar7;
  bool bVar8;
  undefined8 uVar4;
  
  this->m_gl = (Functions *)ctx;
  (**(code **)(ctx + 0x708))(1,&this->m_vertex_array_object_id);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"Failed to generate VAO.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0x13d0);
  (*this->m_gl->bindVertexArray)(this->m_vertex_array_object_id);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"Failed to bind VAO.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0x13d3);
  iVar1 = *(int *)(in_RDX + 0x20);
  attribute = (attributeDefinition *)0x0;
  paVar6 = getAttributes::depth_attributes;
  if (iVar1 != 3) {
    paVar6 = attribute;
  }
  uVar5 = (ulong)*in_RCX;
  lVar7 = 0;
  if (uVar5 < 4) {
    attribute = (attributeDefinition *)(&PTR_texture_attributes_01e04838)[uVar5];
    lVar7 = *(long *)(&DAT_017ccf00 + uVar5 * 8);
  }
  setupAttribute(this,(attributeDefinition *)&DAT_01e047b8,in_R8,in_R9D);
  uVar4 = extraout_RAX;
  while( true ) {
    iVar3 = (int)uVar4;
    bVar8 = lVar7 == 0;
    lVar7 = lVar7 + -1;
    if (bVar8) break;
    setupAttribute(this,attribute,in_R8,in_R9D);
    attribute = attribute + 1;
    uVar4 = extraout_RAX_00;
  }
  if (iVar1 == 3) {
    uVar5 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
    lVar7 = 0;
    while (iVar3 = (int)uVar5, (uVar5 & 1) != 0) {
      setupAttribute(this,paVar6 + lVar7,in_R8,in_R9D);
      lVar7 = 1;
      uVar5 = 0;
    }
  }
  return iVar3;
}

Assistant:

void TextureCubeMapArraySamplingTest::vertexArrayObjectDefinition::init(const glw::Functions&   gl,
																		const formatDefinition& format,
																		const samplingFunction& sampling_function,
																		const bufferCollection& buffers,
																		glw::GLuint				program_id)
{
	m_gl = &gl;

	m_gl->genVertexArrays(1, &m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to generate VAO.");

	m_gl->bindVertexArray(m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to bind VAO.");

	attributeDefinition		   positionAttribute = { vertex_shader_position, type_vec4, Position, 0 };
	const attributeDefinition* format_attributes;
	glw::GLuint				   n_format_attributes;
	const attributeDefinition* routine_attributes   = 0;
	glw::GLuint				   n_routine_attributes = 0;

	getAttributes(format.m_sampler_type, format_attributes, n_format_attributes);
	getAttributes(sampling_function, routine_attributes, n_routine_attributes);

	setupAttribute(positionAttribute, buffers, program_id);

	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		setupAttribute(routine_attributes[i], buffers, program_id);
	}

	for (glw::GLuint i = 0; i < n_format_attributes; ++i)
	{
		setupAttribute(format_attributes[i], buffers, program_id);
	}
}